

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O0

void __thiscall
DenseHashMapMoveTest_InsertRValue_ValueMoveCount_Test::TestBody
          (DenseHashMapMoveTest_InsertRValue_ValueMoveCount_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  h;
  pair<int,_A> *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  undefined1 uVar3;
  key_equal *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  undefined1 uVar4;
  char *in_stack_fffffffffffffe88;
  int line;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  undefined1 uVar5;
  undefined8 in_stack_fffffffffffffe98;
  Type type;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 uVar6;
  AssertionResult local_130;
  Message *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 uVar7;
  AssertionResult local_108 [2];
  undefined4 local_e4;
  AssertionResult local_e0;
  uint local_cc;
  undefined4 local_b4;
  AssertionResult local_b0 [3];
  A local_80;
  undefined4 local_7c;
  undefined4 local_70;
  libc_allocator_with_realloc<std::pair<const_int,_A>_> local_5b [91];
  
  type = (Type)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  google::libc_allocator_with_realloc<std::pair<const_int,_A>_>::libc_allocator_with_realloc
            (local_5b);
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::dense_hash_map((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                   (size_type)in_stack_fffffffffffffe88,
                   (hasher *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe78,
                   (allocator_type *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  google::libc_allocator_with_realloc<std::pair<const_int,_A>_>::~libc_allocator_with_realloc
            (local_5b);
  local_70 = 0;
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::set_empty_key((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                   *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                  &in_stack_fffffffffffffe68->first);
  A::reset();
  local_7c = 5;
  local_80._i = 0;
  A::A(&local_80);
  std::make_pair<int,A>
            ((int *)in_stack_fffffffffffffe78,
             (A *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  google::
  dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
  ::insert<std::pair<int,A>,void>
            ((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
              *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
             in_stack_fffffffffffffe68);
  local_b4 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffe88,
             (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (int *)in_stack_fffffffffffffe78,
             (int *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b0);
  uVar6 = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_fffffffffffffea0));
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1079eb0);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffea0),type,
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    testing::Message::~Message((Message *)0x1079f0d);
  }
  local_cc = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1079f7b);
  if (local_cc == 0) {
    local_e4 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffe88,
               (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               (int *)in_stack_fffffffffffffe78,
               (int *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
    uVar5 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffea0));
      in_stack_fffffffffffffe88 =
           testing::AssertionResult::failure_message((AssertionResult *)0x107a02c);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffea0),type,
                 (char *)CONCAT17(uVar5,in_stack_fffffffffffffe90),
                 (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
      testing::Message::~Message((Message *)0x107a089);
    }
    local_cc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x107a0f7);
    if (local_cc == 0) {
      uVar7 = 2;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffe88,
                 (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                 (int *)in_stack_fffffffffffffe78,
                 (int *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_108);
      uVar4 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffea0));
        in_stack_fffffffffffffe78 =
             (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0x107a1a8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffea0),type,
                   (char *)CONCAT17(uVar5,in_stack_fffffffffffffe90),
                   (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                   (char *)CONCAT17(uVar4,in_stack_fffffffffffffe80));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(uVar7,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffee8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
        testing::Message::~Message((Message *)0x107a1fc);
      }
      local_cc = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x107a264);
      if (local_cc == 0) {
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  (in_stack_fffffffffffffe88,(char *)CONCAT17(uVar4,in_stack_fffffffffffffe80),
                   (int *)in_stack_fffffffffffffe78,
                   (int *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
        line = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
        if (!bVar1) {
          uVar3 = bVar1;
          testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffea0));
          testing::AssertionResult::failure_message((AssertionResult *)0x107a303);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffea0),type,
                     (char *)CONCAT17(uVar5,in_stack_fffffffffffffe90),line,
                     (char *)CONCAT17(uVar4,in_stack_fffffffffffffe80));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(uVar7,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffe70));
          testing::Message::~Message((Message *)0x107a34f);
        }
        local_cc = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x107a3b1);
        if (local_cc == 0) {
          local_cc = 0;
        }
      }
    }
  }
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::~dense_hash_map((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                     *)0x107a3d6);
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, InsertRValue_ValueMoveCount)
{
    dense_hash_map<int, A> h(10);
    h.set_empty_key(0);

    A::reset();
    h.insert(std::make_pair(5, A()));

    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(2, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);
}